

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimCreator.cpp
# Opt level: O1

void __thiscall OpenMD::SimCreator::setGlobalIndex(SimCreator *this,SimInfo *info)

{
  pointer ppAVar1;
  pointer ppRVar2;
  pointer ppCVar3;
  pointer ppBVar4;
  pointer ppBVar5;
  pointer ppTVar6;
  pointer ppIVar7;
  void *pvVar8;
  Molecule *pMVar9;
  pointer ppAVar10;
  pointer ppRVar11;
  pointer ppCVar12;
  pointer ppBVar13;
  pointer ppBVar14;
  pointer ppTVar15;
  pointer ppIVar16;
  long lVar17;
  pointer ppSVar18;
  Inversion *pIVar19;
  CutoffGroup *pCVar20;
  StuntDouble *pSVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  Atom *pAVar27;
  RigidBody *pRVar28;
  Bond *pBVar29;
  Bend *pBVar30;
  Torsion *pTVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  MoleculeIterator mi;
  vector<int,_std::allocator<int>_> nIOPerMol;
  vector<int,_std::allocator<int>_> globalMolMembership;
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> IOIndexToIntegrableObject;
  vector<int,_std::allocator<int>_> startingIOIndexForMol;
  vector<int,_std::allocator<int>_> numIntegrableObjectsPerMol;
  vector<int,_std::allocator<int>_> globalGroupMembership;
  MoleculeIterator local_e8;
  allocator_type local_dd;
  int local_dc;
  ulong local_d8;
  vector<int,_std::allocator<int>_> local_d0;
  vector<int,_std::allocator<int>_> local_b8;
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> local_a0;
  vector<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> local_70;
  vector<int,_std::allocator<int>_> local_58;
  SimInfo *local_40;
  value_type local_38;
  
  local_e8._M_node = (_Base_ptr)0x0;
  if (0 < info->nGlobalMols_) {
    iVar25 = info->nGlobalAtoms_;
    uVar26 = 0;
    iVar35 = 0;
    iVar32 = 0;
    iVar33 = 0;
    iVar22 = 0;
    iVar34 = 0;
    iVar23 = 0;
    local_40 = info;
    do {
      local_dc = iVar25;
      local_d8 = uVar26;
      pMVar9 = SimInfo::getMoleculeByGlobalIndex(local_40,(int)uVar26);
      ppAVar10 = (pMVar9->atoms_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppAVar1 = (pMVar9->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppAVar10 == ppAVar1) {
        pAVar27 = (Atom *)0x0;
      }
      else {
        pAVar27 = *ppAVar10;
      }
      while (pAVar27 != (Atom *)0x0) {
        ppAVar10 = ppAVar10 + 1;
        (pAVar27->super_StuntDouble).globalIndex_ = iVar23;
        if (ppAVar10 == ppAVar1) {
          pAVar27 = (Atom *)0x0;
        }
        else {
          pAVar27 = *ppAVar10;
        }
        iVar23 = iVar23 + 1;
      }
      ppRVar11 = (pMVar9->rigidBodies_).
                 super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppRVar2 = (pMVar9->rigidBodies_).
                super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      iVar25 = local_dc;
      if (ppRVar11 == ppRVar2) {
        pRVar28 = (RigidBody *)0x0;
      }
      else {
        pRVar28 = *ppRVar11;
      }
      while (pRVar28 != (RigidBody *)0x0) {
        ppRVar11 = ppRVar11 + 1;
        (pRVar28->super_StuntDouble).globalIndex_ = iVar25;
        if (ppRVar11 == ppRVar2) {
          pRVar28 = (RigidBody *)0x0;
        }
        else {
          pRVar28 = *ppRVar11;
        }
        iVar25 = iVar25 + 1;
      }
      ppCVar12 = (pMVar9->cutoffGroups_).
                 super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppCVar3 = (pMVar9->cutoffGroups_).
                super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar12 == ppCVar3) {
        pCVar20 = (CutoffGroup *)0x0;
      }
      else {
        pCVar20 = *ppCVar12;
      }
      while (pCVar20 != (CutoffGroup *)0x0) {
        ppCVar12 = ppCVar12 + 1;
        pCVar20->globalIndex = iVar34;
        if (ppCVar12 == ppCVar3) {
          pCVar20 = (CutoffGroup *)0x0;
        }
        else {
          pCVar20 = *ppCVar12;
        }
        iVar34 = iVar34 + 1;
      }
      ppBVar13 = (pMVar9->bonds_).
                 super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppBVar4 = (pMVar9->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppBVar13 == ppBVar4) {
        pBVar29 = (Bond *)0x0;
      }
      else {
        pBVar29 = *ppBVar13;
      }
      while (pBVar29 != (Bond *)0x0) {
        ppBVar13 = ppBVar13 + 1;
        (pBVar29->super_ShortRangeInteraction).globalIndex_ = iVar22;
        if (ppBVar13 == ppBVar4) {
          pBVar29 = (Bond *)0x0;
        }
        else {
          pBVar29 = *ppBVar13;
        }
        iVar22 = iVar22 + 1;
      }
      ppBVar14 = (pMVar9->bends_).
                 super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppBVar5 = (pMVar9->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppBVar14 == ppBVar5) {
        pBVar30 = (Bend *)0x0;
      }
      else {
        pBVar30 = *ppBVar14;
      }
      while (pBVar30 != (Bend *)0x0) {
        ppBVar14 = ppBVar14 + 1;
        (pBVar30->super_ShortRangeInteraction).globalIndex_ = iVar33;
        if (ppBVar14 == ppBVar5) {
          pBVar30 = (Bend *)0x0;
        }
        else {
          pBVar30 = *ppBVar14;
        }
        iVar33 = iVar33 + 1;
      }
      ppTVar15 = (pMVar9->torsions_).
                 super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppTVar6 = (pMVar9->torsions_).
                super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppTVar15 == ppTVar6) {
        pTVar31 = (Torsion *)0x0;
      }
      else {
        pTVar31 = *ppTVar15;
      }
      while (pTVar31 != (Torsion *)0x0) {
        ppTVar15 = ppTVar15 + 1;
        (pTVar31->super_ShortRangeInteraction).globalIndex_ = iVar32;
        if (ppTVar15 == ppTVar6) {
          pTVar31 = (Torsion *)0x0;
        }
        else {
          pTVar31 = *ppTVar15;
        }
        iVar32 = iVar32 + 1;
      }
      ppIVar16 = (pMVar9->inversions_).
                 super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppIVar7 = (pMVar9->inversions_).
                super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppIVar16 == ppIVar7) {
        pIVar19 = (Inversion *)0x0;
      }
      else {
        pIVar19 = *ppIVar16;
      }
      while (pIVar19 != (Inversion *)0x0) {
        ppIVar16 = ppIVar16 + 1;
        (pIVar19->super_ShortRangeInteraction).globalIndex_ = iVar35;
        if (ppIVar16 == ppIVar7) {
          pIVar19 = (Inversion *)0x0;
        }
        else {
          pIVar19 = *ppIVar16;
        }
        iVar35 = iVar35 + 1;
      }
      uVar24 = (int)local_d8 + 1;
      uVar26 = (ulong)uVar24;
      info = local_40;
    } while ((int)uVar24 < local_40->nGlobalMols_);
  }
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_58,(long)info->nGlobalAtoms_,(value_type_conflict2 *)&local_b8,
             (allocator_type *)&local_d0);
  pMVar9 = SimInfo::beginMolecule(info,&local_e8);
  while (pMVar9 != (Molecule *)0x0) {
    ppCVar12 = (pMVar9->cutoffGroups_).
               super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppCVar3 = (pMVar9->cutoffGroups_).
              super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppCVar12 == ppCVar3) {
      pCVar20 = (CutoffGroup *)0x0;
    }
    else {
      pCVar20 = *ppCVar12;
    }
    while (pCVar20 != (CutoffGroup *)0x0) {
      ppAVar10 = (pCVar20->cutoffAtomList).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppAVar1 = (pCVar20->cutoffAtomList).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppAVar10 == ppAVar1) {
        pAVar27 = (Atom *)0x0;
      }
      else {
        pAVar27 = *ppAVar10;
      }
      while (pAVar27 != (Atom *)0x0) {
        ppAVar10 = ppAVar10 + 1;
        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(pAVar27->super_StuntDouble).globalIndex_] = pCVar20->globalIndex;
        if (ppAVar10 == ppAVar1) {
          pAVar27 = (Atom *)0x0;
        }
        else {
          pAVar27 = *ppAVar10;
        }
      }
      ppCVar12 = ppCVar12 + 1;
      if (ppCVar12 == ppCVar3) {
        pCVar20 = (CutoffGroup *)0x0;
      }
      else {
        pCVar20 = *ppCVar12;
      }
    }
    pMVar9 = SimInfo::nextMolecule(info,&local_e8);
  }
  std::vector<int,_std::allocator<int>_>::operator=(&info->globalGroupMembership_,&local_58);
  local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_b8,(long)info->nGlobalRigidBodies_ + (long)info->nGlobalAtoms_,
             (value_type_conflict2 *)&local_d0,(allocator_type *)&local_70);
  pMVar9 = SimInfo::beginMolecule(info,&local_e8);
  while (pMVar9 != (Molecule *)0x0) {
    ppAVar10 = (pMVar9->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppAVar1 = (pMVar9->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppAVar10 == ppAVar1) {
      pAVar27 = (Atom *)0x0;
    }
    else {
      pAVar27 = *ppAVar10;
    }
    if (pAVar27 != (Atom *)0x0) {
      do {
        ppAVar10 = ppAVar10 + 1;
        *(int *)(CONCAT44(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) +
                (long)(pAVar27->super_StuntDouble).globalIndex_ * 4) = pMVar9->globalIndex_;
        if (ppAVar10 == ppAVar1) {
          pAVar27 = (Atom *)0x0;
        }
        else {
          pAVar27 = *ppAVar10;
        }
      } while (pAVar27 != (Atom *)0x0);
    }
    ppRVar11 = (pMVar9->rigidBodies_).
               super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppRVar2 = (pMVar9->rigidBodies_).
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppRVar11 == ppRVar2) {
      pRVar28 = (RigidBody *)0x0;
    }
    else {
      pRVar28 = *ppRVar11;
    }
    if (pRVar28 != (RigidBody *)0x0) {
      do {
        ppRVar11 = ppRVar11 + 1;
        *(int *)(CONCAT44(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) +
                (long)(pRVar28->super_StuntDouble).globalIndex_ * 4) = pMVar9->globalIndex_;
        if (ppRVar11 == ppRVar2) {
          pRVar28 = (RigidBody *)0x0;
        }
        else {
          pRVar28 = *ppRVar11;
        }
      } while (pRVar28 != (RigidBody *)0x0);
    }
    pMVar9 = SimInfo::nextMolecule(info,&local_e8);
  }
  std::vector<int,_std::allocator<int>_>::operator=(&info->globalMolMembership_,&local_b8);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_d0,(long)info->nGlobalMols_,(value_type_conflict2 *)&local_70,
             (allocator_type *)&local_88);
  pMVar9 = SimInfo::beginMolecule(info,&local_e8);
  while (pMVar9 != (Molecule *)0x0) {
    *(int *)(CONCAT44(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_) + (long)pMVar9->globalIndex_ * 4) =
         (int)((ulong)((long)(pMVar9->integrableObjects_).
                             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pMVar9->integrableObjects_).
                            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
    pMVar9 = SimInfo::nextMolecule(info,&local_e8);
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_70,&local_d0);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_88,(long)info->nGlobalMols_,(allocator_type *)&local_a0);
  if (0 < info->nGlobalMols_) {
    lVar17 = 0;
    iVar25 = 0;
    do {
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar17] = iVar25;
      iVar25 = iVar25 + *(int *)(CONCAT44(local_70.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                                          local_70.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                lVar17 * 4);
      lVar17 = lVar17 + 1;
    } while (lVar17 < info->nGlobalMols_);
  }
  local_38 = (value_type)0x0;
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::vector
            (&local_a0,(long)info->nGlobalIntegrableObjects_,&local_38,&local_dd);
  pMVar9 = SimInfo::beginMolecule(info,&local_e8);
  while (pMVar9 != (Molecule *)0x0) {
    ppSVar18 = (pMVar9->integrableObjects_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar18 ==
        (pMVar9->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar21 = (StuntDouble *)0x0;
    }
    else {
      pSVar21 = *ppSVar18;
    }
    if (pSVar21 != (StuntDouble *)0x0) {
      lVar17 = (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[pMVar9->globalIndex_];
      do {
        ppSVar18 = ppSVar18 + 1;
        pSVar21->globalIntegrableObjectIndex_ = (int)lVar17;
        local_a0.super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar17] = pSVar21;
        if (ppSVar18 ==
            (pMVar9->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar21 = (StuntDouble *)0x0;
        }
        else {
          pSVar21 = *ppSVar18;
        }
        lVar17 = lVar17 + 1;
      } while (pSVar21 != (StuntDouble *)0x0);
    }
    pMVar9 = SimInfo::nextMolecule(info,&local_e8);
  }
  SimInfo::setIOIndexToIntegrableObject(info,&local_a0);
  if (local_a0.super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.
                    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.
                          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.
                          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar8 = (void *)CONCAT44(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar8 != (void *)0x0) {
    operator_delete(pvVar8,(long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar8);
  }
  pvVar8 = (void *)CONCAT44(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar8 != (void *)0x0) {
    operator_delete(pvVar8,(long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar8);
  }
  pvVar8 = (void *)CONCAT44(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar8 != (void *)0x0) {
    operator_delete(pvVar8,(long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar8);
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SimCreator::setGlobalIndex(SimInfo* info) {
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator ri;
    Molecule::CutoffGroupIterator ci;
    Molecule::BondIterator boi;
    Molecule::BendIterator bei;
    Molecule::TorsionIterator ti;
    Molecule::InversionIterator ii;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    CutoffGroup* cg;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;
    int beginAtomIndex;
    int beginRigidBodyIndex;
    int beginCutoffGroupIndex;
    int beginBondIndex;
    int beginBendIndex;
    int beginTorsionIndex;
    int beginInversionIndex;
#ifdef IS_MPI
    int nGlobalAtoms       = info->getNGlobalAtoms();
    int nGlobalRigidBodies = info->getNGlobalRigidBodies();
#endif

    beginAtomIndex = 0;
    // The rigid body indices begin immediately after the atom indices:
    beginRigidBodyIndex   = info->getNGlobalAtoms();
    beginCutoffGroupIndex = 0;
    beginBondIndex        = 0;
    beginBendIndex        = 0;
    beginTorsionIndex     = 0;
    beginInversionIndex   = 0;

    for (int i = 0; i < info->getNGlobalMolecules(); i++) {
#ifdef IS_MPI
      if (info->getMolToProc(i) == worldRank) {
#endif
        // stuff to do if I own this molecule
        mol = info->getMoleculeByGlobalIndex(i);

        // The local index(index in DataStorge) of the atom is important:
        for (atom = mol->beginAtom(ai); atom != NULL;
             atom = mol->nextAtom(ai)) {
          atom->setGlobalIndex(beginAtomIndex++);
        }

        for (rb = mol->beginRigidBody(ri); rb != NULL;
             rb = mol->nextRigidBody(ri)) {
          rb->setGlobalIndex(beginRigidBodyIndex++);
        }

        // The local index of other objects only depends on the order
        // of traversal:
        for (cg = mol->beginCutoffGroup(ci); cg != NULL;
             cg = mol->nextCutoffGroup(ci)) {
          cg->setGlobalIndex(beginCutoffGroupIndex++);
        }
        for (bond = mol->beginBond(boi); bond != NULL;
             bond = mol->nextBond(boi)) {
          bond->setGlobalIndex(beginBondIndex++);
        }
        for (bend = mol->beginBend(bei); bend != NULL;
             bend = mol->nextBend(bei)) {
          bend->setGlobalIndex(beginBendIndex++);
        }
        for (torsion = mol->beginTorsion(ti); torsion != NULL;
             torsion = mol->nextTorsion(ti)) {
          torsion->setGlobalIndex(beginTorsionIndex++);
        }
        for (inversion = mol->beginInversion(ii); inversion != NULL;
             inversion = mol->nextInversion(ii)) {
          inversion->setGlobalIndex(beginInversionIndex++);
        }

#ifdef IS_MPI
      } else {
        // stuff to do if I don't own this molecule

        int stampId          = info->getMoleculeStampId(i);
        MoleculeStamp* stamp = info->getMoleculeStamp(stampId);

        beginAtomIndex += stamp->getNAtoms();
        beginRigidBodyIndex += stamp->getNRigidBodies();
        beginCutoffGroupIndex +=
            stamp->getNCutoffGroups() + stamp->getNFreeAtoms();
        beginBondIndex += stamp->getNBonds();
        beginBendIndex += stamp->getNBends();
        beginTorsionIndex += stamp->getNTorsions();
        beginInversionIndex += stamp->getNInversions();
      }
#endif

    }  // end for(int i=0)

    // fill globalGroupMembership
    std::vector<int> globalGroupMembership(info->getNGlobalAtoms(), 0);
    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      for (cg = mol->beginCutoffGroup(ci); cg != NULL;
           cg = mol->nextCutoffGroup(ci)) {
        for (atom = cg->beginAtom(ai); atom != NULL; atom = cg->nextAtom(ai)) {
          globalGroupMembership[atom->getGlobalIndex()] = cg->getGlobalIndex();
        }
      }
    }

#ifdef IS_MPI
    // Since the globalGroupMembership has been zero filled and we've only
    // poked values into the atoms we know, we can do an Allreduce
    // to get the full globalGroupMembership array (We think).
    // This would be prettier if we could use MPI_IN_PLACE like the MPI-2
    // docs said we could.
    std::vector<int> tmpGroupMembership(info->getNGlobalAtoms(), 0);
    MPI_Allreduce(&globalGroupMembership[0], &tmpGroupMembership[0],
                  nGlobalAtoms, MPI_INT, MPI_SUM, MPI_COMM_WORLD);

    info->setGlobalGroupMembership(tmpGroupMembership);
#else
    info->setGlobalGroupMembership(globalGroupMembership);
#endif

    // fill molMembership
    std::vector<int> globalMolMembership(
        info->getNGlobalAtoms() + info->getNGlobalRigidBodies(), 0);

    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        globalMolMembership[atom->getGlobalIndex()] = mol->getGlobalIndex();
      }
      for (rb = mol->beginRigidBody(ri); rb != NULL;
           rb = mol->nextRigidBody(ri)) {
        globalMolMembership[rb->getGlobalIndex()] = mol->getGlobalIndex();
      }
    }

#ifdef IS_MPI
    std::vector<int> tmpMolMembership(
        info->getNGlobalAtoms() + info->getNGlobalRigidBodies(), 0);
    MPI_Allreduce(&globalMolMembership[0], &tmpMolMembership[0],
                  nGlobalAtoms + nGlobalRigidBodies, MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);

    info->setGlobalMolMembership(tmpMolMembership);
#else
    info->setGlobalMolMembership(globalMolMembership);
#endif

    // nIOPerMol holds the number of integrable objects per molecule
    // here the molecules are listed by their global indices.

    std::vector<int> nIOPerMol(info->getNGlobalMolecules(), 0);
    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      nIOPerMol[mol->getGlobalIndex()] = mol->getNIntegrableObjects();
    }

#ifdef IS_MPI
    std::vector<int> numIntegrableObjectsPerMol(info->getNGlobalMolecules(), 0);
    MPI_Allreduce(&nIOPerMol[0], &numIntegrableObjectsPerMol[0],
                  info->getNGlobalMolecules(), MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);
#else
    std::vector<int> numIntegrableObjectsPerMol = nIOPerMol;
#endif

    std::vector<int> startingIOIndexForMol(info->getNGlobalMolecules());

    int startingIndex = 0;
    for (int i = 0; i < info->getNGlobalMolecules(); i++) {
      startingIOIndexForMol[i] = startingIndex;
      startingIndex += numIntegrableObjectsPerMol[i];
    }

    std::vector<StuntDouble*> IOIndexToIntegrableObject(
        info->getNGlobalIntegrableObjects(), (StuntDouble*)NULL);
    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      int myGlobalIndex = mol->getGlobalIndex();
      int globalIO      = startingIOIndexForMol[myGlobalIndex];
      for (StuntDouble* sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd              = mol->nextIntegrableObject(ioi)) {
        sd->setGlobalIntegrableObjectIndex(globalIO);
        IOIndexToIntegrableObject[globalIO] = sd;
        globalIO++;
      }
    }

    info->setIOIndexToIntegrableObject(IOIndexToIntegrableObject);
  }